

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O3

MPP_RET hal_jpege_vepu2_deinit(void *hal)

{
  long lVar1;
  MppBuffer buffer;
  JpegeMultiCoreCtx *ctx_ext;
  long lVar2;
  
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter hal %p\n","hal_jpege_vepu2_deinit",hal);
  }
  if (*(JpegeBits *)((long)hal + 0x10) != (JpegeBits)0x0) {
    jpege_bits_deinit(*(JpegeBits *)((long)hal + 0x10));
    *(undefined8 *)((long)hal + 0x10) = 0;
  }
  if (*hal != (MppDev)0x0) {
    mpp_dev_deinit(*hal);
    *(undefined8 *)hal = 0;
  }
  hal_jpege_vepu_deinit_rc((HalJpegeRc *)((long)hal + 0x130));
  lVar1 = *(long *)((long)hal + 0x170);
  if (lVar1 != 0) {
    if (*(MppDevRegOffCfgs **)(lVar1 + 8) != (MppDevRegOffCfgs *)0x0) {
      mpp_dev_multi_offset_deinit(*(MppDevRegOffCfgs **)(lVar1 + 8));
      *(undefined8 *)(lVar1 + 8) = 0;
    }
    lVar2 = 0;
    do {
      buffer = *(MppBuffer *)(lVar1 + 0x18 + lVar2 * 8);
      if (buffer != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(buffer,"hal_jpege_vepu2_deinit");
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    if (*(MppBufferGroup *)(lVar1 + 0x10) != (MppBufferGroup)0x0) {
      mpp_buffer_group_put(*(MppBufferGroup *)(lVar1 + 0x10));
      *(undefined8 *)(lVar1 + 0x10) = 0;
    }
    if (*(void **)(lVar1 + 0x58) != (void *)0x0) {
      mpp_osal_free("hal_jpege_vepu2_deinit",*(void **)(lVar1 + 0x58));
    }
    *(undefined8 *)(lVar1 + 0x58) = 0;
    if (*(void **)((long)hal + 0x170) != (void *)0x0) {
      mpp_osal_free("hal_jpege_vepu2_deinit",*(void **)((long)hal + 0x170));
    }
    *(undefined8 *)((long)hal + 0x170) = 0;
  }
  if (*(void **)((long)hal + 0x18) != (void *)0x0) {
    mpp_osal_free("hal_jpege_vepu2_deinit",*(void **)((long)hal + 0x18));
  }
  *(undefined8 *)((long)hal + 0x18) = 0;
  if (*(void **)((long)hal + 0x20) != (void *)0x0) {
    mpp_osal_free("hal_jpege_vepu2_deinit",*(void **)((long)hal + 0x20));
  }
  *(undefined8 *)((long)hal + 0x20) = 0;
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave hal %p\n","hal_jpege_vepu2_deinit",hal);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu2_deinit(void *hal)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    if (ctx->bits) {
        jpege_bits_deinit(ctx->bits);
        ctx->bits = NULL;
    }

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    hal_jpege_vepu_deinit_rc(&ctx->hal_rc);

    if (ctx->ctx_ext) {
        JpegeMultiCoreCtx *ctx_ext = ctx->ctx_ext;
        RK_U32 i;

        if (ctx_ext->reg_cfg) {
            mpp_dev_multi_offset_deinit(ctx_ext->reg_cfg);
            ctx_ext->reg_cfg = NULL;
        }

        for (i = 0; i < MAX_CORE_NUM - 1; i++)
            if (ctx_ext->partions_buf[i])
                mpp_buffer_put(ctx_ext->partions_buf[i]);

        if (ctx_ext->partions_group) {
            mpp_buffer_group_put(ctx_ext->partions_group);
            ctx_ext->partions_group = NULL;
        }

        MPP_FREE(ctx_ext->regs_base);
        MPP_FREE(ctx->ctx_ext);
    }

    MPP_FREE(ctx->regs);
    MPP_FREE(ctx->regs_out);

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return MPP_OK;
}